

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::VarToNativeArray
               (Var arrayObject,JsNativeValueType valueType,UINT length,UINT elementSize,
               byte *buffer,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  DynamicObject *pDVar5;
  undefined4 *puVar6;
  JavascriptArray *arrayObject_00;
  JavascriptNativeFloatArray *arrayObject_01;
  JavascriptNativeIntArray *arrayObject_02;
  DynamicObject *dynamicObject;
  ScriptContext *scriptContext_local;
  byte *buffer_local;
  UINT elementSize_local;
  UINT length_local;
  JsNativeValueType valueType_local;
  Var arrayObject_local;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  _length_local = arrayObject;
  pDVar5 = VarTo<Js::DynamicObject>(arrayObject);
  iVar3 = (*(pDVar5->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x66])();
  if ((iVar3 != 0) || (bVar2 = TaggedInt::IsOverflow(length), bVar2)) {
    ObjectToNativeArray<void*>
              ((void **)&length_local,valueType,length,elementSize,buffer,scriptContext);
  }
  else {
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(_length_local);
    arrayObject_local = _length_local;
    if (_length_local == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = TaggedInt::Is(arrayObject_local);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(arrayObject_local);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(arrayObject_local);
        if (pRStack_10 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        local_14 = RecyclableObject::GetTypeId(pRStack_10);
        if ((0x57 < (int)local_14) && (BVar4 = RecyclableObject::IsExternal(pRStack_10), BVar4 == 0)
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        local_18 = local_14;
      }
    }
    if (local_18 == TypeIds_Array) {
      arrayObject_00 = UnsafeVarTo<Js::JavascriptArray>(_length_local);
      ObjectToNativeArray<Js::JavascriptArray>
                (arrayObject_00,valueType,length,elementSize,buffer,scriptContext);
    }
    else if (local_18 == TypeIds_NativeIntArray) {
      arrayObject_02 = UnsafeVarTo<Js::JavascriptNativeIntArray>(_length_local);
      ObjectToNativeArray<Js::JavascriptNativeIntArray>
                (arrayObject_02,valueType,length,elementSize,buffer,scriptContext);
    }
    else if (local_18 == TypeIds_ArrayLast) {
      arrayObject_01 = UnsafeVarTo<Js::JavascriptNativeFloatArray>(_length_local);
      ObjectToNativeArray<Js::JavascriptNativeFloatArray>
                (arrayObject_01,valueType,length,elementSize,buffer,scriptContext);
    }
    else {
      ObjectToNativeArray<void*>
                ((void **)&length_local,valueType,length,elementSize,buffer,scriptContext);
    }
  }
  return;
}

Assistant:

void JavascriptOperators::VarToNativeArray(Var arrayObject,
        JsNativeValueType valueType,
        __in UINT length,
        __in UINT elementSize,
        __out_bcount(length*elementSize) byte* buffer,
        Js::ScriptContext* scriptContext)
    {
        Js::DynamicObject* dynamicObject = VarTo<DynamicObject>(arrayObject);
        if (dynamicObject->IsCrossSiteObject() || Js::TaggedInt::IsOverflow(length))
        {
            Js::JavascriptOperators::ObjectToNativeArray(&arrayObject, valueType, length, elementSize, buffer, scriptContext);
        }
        else
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(arrayObject);
#endif
            switch (Js::JavascriptOperators::GetTypeId(arrayObject))
            {
            case TypeIds_Array:
                Js::JavascriptOperators::ObjectToNativeArray(Js::UnsafeVarTo<Js::JavascriptArray>(arrayObject), valueType, length, elementSize, buffer, scriptContext);
                break;
            case TypeIds_NativeFloatArray:
                Js::JavascriptOperators::ObjectToNativeArray(Js::UnsafeVarTo<Js::JavascriptNativeFloatArray>(arrayObject), valueType, length, elementSize, buffer, scriptContext);
                break;
            case TypeIds_NativeIntArray:
                Js::JavascriptOperators::ObjectToNativeArray(Js::UnsafeVarTo<Js::JavascriptNativeIntArray>(arrayObject), valueType, length, elementSize, buffer, scriptContext);
                break;
                // We can have more specialized template if needed.
            default:
                Js::JavascriptOperators::ObjectToNativeArray(&arrayObject, valueType, length, elementSize, buffer, scriptContext);
            }
        }
    }